

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

RawHeadersList * QNetworkHeadersPrivate::fromHttpToRaw(QHttpHeaders *headers)

{
  QByteArrayView a;
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  qsizetype qVar4;
  longlong *plVar5;
  RawHeadersList *in_RDI;
  long in_FS_OFFSET;
  bool isSetCookie;
  qsizetype i;
  RawHeadersList *list;
  iterator it;
  QByteArray name;
  QByteArrayView value;
  QLatin1StringView nameL1;
  QHash<QByteArray,_long_long> nameToIndex;
  QByteArrayView *in_stack_fffffffffffffef8;
  QByteArrayView *in_stack_ffffffffffffff00;
  QLatin1String *in_stack_ffffffffffffff08;
  QByteArrayView *this;
  RawHeadersList *this_00;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QByteArrayView *local_d0;
  qsizetype in_stack_ffffffffffffff68;
  QByteArray local_68;
  QByteArrayView local_50;
  QByteArrayView local_30;
  QLatin1StringView local_20;
  QHash<QByteArray,_long_long> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QHttpHeaders::isEmpty((QHttpHeaders *)0x1f30ad);
  if (bVar2) {
    memset(in_RDI,0,0x18);
    QList<std::pair<QByteArray,_QByteArray>_>::QList
              ((QList<std::pair<QByteArray,_QByteArray>_> *)0x1f30ce);
  }
  else {
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (pair<QByteArray,_QByteArray> *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QList<std::pair<QByteArray,_QByteArray>_>::QList
              ((QList<std::pair<QByteArray,_QByteArray>_> *)0x1f3102);
    local_10.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QHash<QByteArray,_long_long>::QHash(&local_10);
    QHttpHeaders::size((QHttpHeaders *)in_stack_fffffffffffffef8);
    QList<std::pair<QByteArray,_QByteArray>_>::reserve
              ((QList<std::pair<QByteArray,_QByteArray>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff68);
    QHttpHeaders::size((QHttpHeaders *)in_stack_fffffffffffffef8);
    QHash<QByteArray,_long_long>::reserve
              ((QHash<QByteArray,_long_long> *)in_stack_ffffffffffffff00,
               (qsizetype)in_stack_fffffffffffffef8);
    local_d0 = (QByteArrayView *)0x0;
    while (this = local_d0, qVar4 = QHttpHeaders::size((QHttpHeaders *)in_stack_fffffffffffffef8),
          (long)this < qVar4) {
      local_20.m_data = (char *)0xaaaaaaaaaaaaaaaa;
      local_20.m_size = -0x5555555555555556;
      local_20 = QHttpHeaders::nameAt((QHttpHeaders *)this_00,(qsizetype)in_RDI);
      local_30.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      local_30.m_size = 0xaaaaaaaaaaaaaaaa;
      local_30 = QHttpHeaders::valueAt((QHttpHeaders *)this,(qsizetype)in_stack_ffffffffffffff08);
      QByteArrayView::QByteArrayView<QLatin1String,_true>(this,in_stack_ffffffffffffff08);
      local_50 = QHttpHeaders::wellKnownHeaderName
                           ((WellKnownHeader)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      bVar3 = ::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_68.d.size = -0x5555555555555556;
      in_stack_ffffffffffffff08 = (QLatin1String *)QLatin1String::data(&local_20);
      qVar4 = QLatin1String::size(&local_20);
      QByteArray::QByteArray(&local_68,(char *)in_stack_ffffffffffffff08,qVar4);
      QHash<QByteArray,_long_long>::find
                ((QHash<QByteArray,_long_long> *)in_stack_ffffffffffffff00,
                 (QByteArray *)in_stack_fffffffffffffef8);
      QHash<QByteArray,_long_long>::end((QHash<QByteArray,_long_long> *)in_stack_ffffffffffffff08);
      bVar2 = QHash<QByteArray,_long_long>::iterator::operator!=
                        ((iterator *)in_stack_ffffffffffffff08,(iterator *)in_stack_ffffffffffffff00
                        );
      if (bVar2) {
        pcVar1 = "\", ";
        if ((bVar3 & 1) != 0) {
          pcVar1 = "\n\n";
        }
        in_stack_ffffffffffffff00 = (QByteArrayView *)(pcVar1 + 1);
        QHash<QByteArray,_long_long>::iterator::value((iterator *)0x1f334b);
        QList<std::pair<QByteArray,_QByteArray>_>::operator[]
                  ((QList<std::pair<QByteArray,_QByteArray>_> *)in_stack_ffffffffffffff00,
                   (qsizetype)in_stack_fffffffffffffef8);
        QByteArray::operator+=
                  ((QByteArray *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        QHash<QByteArray,_long_long>::iterator::value((iterator *)0x1f3390);
        QList<std::pair<QByteArray,_QByteArray>_>::operator[]
                  ((QList<std::pair<QByteArray,_QByteArray>_> *)in_stack_ffffffffffffff00,
                   (qsizetype)in_stack_fffffffffffffef8);
        a.m_data = (storage_type *)in_RDI;
        a.m_size = (qsizetype)this;
        QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffef8,a);
      }
      else {
        in_stack_fffffffffffffef8 =
             (QByteArrayView *)QList<std::pair<QByteArray,_QByteArray>_>::size(in_RDI);
        plVar5 = QHash<QByteArray,_long_long>::operator[]
                           ((QHash<QByteArray,_long_long> *)this,
                            (QByteArray *)in_stack_ffffffffffffff08);
        *plVar5 = (longlong)in_stack_fffffffffffffef8;
        QByteArrayView::toByteArray(in_stack_ffffffffffffff00);
        QList<std::pair<QByteArray,QByteArray>>::emplaceBack<QByteArray_const&,QByteArray>
                  (in_RDI,(QByteArray *)this,(QByteArray *)in_stack_ffffffffffffff08);
        QByteArray::~QByteArray((QByteArray *)0x1f3412);
      }
      QByteArray::~QByteArray((QByteArray *)0x1f341f);
      local_d0 = (QByteArrayView *)
                 ((long)&(((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)&local_d0->m_size)->
                         d).ptr + 1);
    }
    QHash<QByteArray,_long_long>::~QHash((QHash<QByteArray,_long_long> *)in_stack_ffffffffffffff00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QNetworkHeadersPrivate::RawHeadersList QNetworkHeadersPrivate::fromHttpToRaw(
        const QHttpHeaders &headers)
{
    if (headers.isEmpty())
        return {};

    QNetworkHeadersPrivate::RawHeadersList list;
    QHash<QByteArray, qsizetype> nameToIndex;
    list.reserve(headers.size());
    nameToIndex.reserve(headers.size());

    for (qsizetype i = 0; i < headers.size(); ++i) {
        const auto nameL1 = headers.nameAt(i);
        const auto value = headers.valueAt(i);

        const bool isSetCookie = nameL1 == QHttpHeaders::wellKnownHeaderName(
                                         QHttpHeaders::WellKnownHeader::SetCookie);

        const auto name = QByteArray(nameL1.data(), nameL1.size());
        if (auto it = nameToIndex.find(name); it != nameToIndex.end()) {
            list[it.value()].second += isSetCookie ? "\n" : ", ";
            list[it.value()].second += value;
        } else {
            nameToIndex[name] = list.size();
            list.emplaceBack(name, value.toByteArray());
        }
    }

    return list;
}